

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STL_Exercises.cpp
# Opt level: O3

void Question_1(void)

{
  iterator __position;
  void *pvVar1;
  istream *piVar2;
  long lVar3;
  int iVar4;
  int m;
  int n;
  int b;
  int a;
  vector<int,_std::allocator<int>_> v [10005];
  undefined8 uStack_3aa30;
  int iStack_3aa28;
  int iStack_3aa24;
  undefined8 uStack_3aa20;
  vector<int,std::allocator<int>> avStack_3aa18 [8];
  undefined8 auStack_3aa10 [30014];
  
  memset(avStack_3aa18,0,0x3a9f8);
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&iStack_3aa24);
  std::istream::operator>>(piVar2,&iStack_3aa28);
  uStack_3aa30._4_4_ = 0;
  if (0 < iStack_3aa24) {
    do {
      lVar3 = (long)uStack_3aa30._4_4_;
      __position._M_current = (int *)auStack_3aa10[lVar3 * 3];
      if (__position._M_current == (int *)auStack_3aa10[lVar3 * 3 + 1]) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (avStack_3aa18 + lVar3 * 0x18,__position,(int *)((long)&uStack_3aa30 + 4));
      }
      else {
        *__position._M_current = uStack_3aa30._4_4_;
        auStack_3aa10[lVar3 * 3] = __position._M_current + 1;
      }
      uStack_3aa30._4_4_ = uStack_3aa30._4_4_ + 1;
    } while (uStack_3aa30._4_4_ < iStack_3aa24);
  }
  if (0 < iStack_3aa28) {
    iVar4 = 0;
    do {
      piVar2 = (istream *)
               std::istream::operator>>((istream *)&std::cin,(int *)((long)&uStack_3aa20 + 4));
      std::istream::operator>>(piVar2,(int *)&uStack_3aa20);
      iVar4 = iVar4 + 1;
    } while (iVar4 < iStack_3aa28);
  }
  lVar3 = 0x3a9f8;
  do {
    pvVar1 = *(void **)((long)&uStack_3aa30 + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&uStack_3aa20 + lVar3) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  return;
}

Assistant:

void Question_1()
{
    vector<int> v[10005]; //vector<int> 数组
    int a,b,n,m;
    cin >> n >> m;
    for (int i = 0; i < n; ++i) {
        v[i].push_back(i);
    }
    for(int i = 0; i < m; i++)
    {
        cin >> a >> b;
        if (a == b)
        {
            continue;
        }

    }
}